

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartsWithTest.cpp
# Opt level: O0

void __thiscall
oout::StartsWithTest::StartsWithTest(StartsWithTest *this,shared_ptr<const_oout::Text> *a,string *b)

{
  string *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *b_local;
  shared_ptr<const_oout::Text> *a_local;
  StartsWithTest *this_local;
  
  local_20 = b;
  b_local = (string *)a;
  a_local = (shared_ptr<const_oout::Text> *)this;
  Test::Test(&this->super_Test);
  __args_1 = b_local;
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__StartsWithTest_003251e8;
  std::make_shared<oout::StartsWithMatch,std::__cxx11::string_const&>(&local_40);
  std::
  make_shared<oout::MatchTest,std::shared_ptr<oout::Text_const>const&,std::shared_ptr<oout::StartsWithMatch>>
            ((shared_ptr<const_oout::Text> *)&local_40.field_2,
             (shared_ptr<oout::StartsWithMatch> *)__args_1);
  std::shared_ptr<oout::Test_const>::shared_ptr<oout::MatchTest,void>
            ((shared_ptr<oout::Test_const> *)&this->test,
             (shared_ptr<oout::MatchTest> *)&local_40.field_2);
  std::shared_ptr<oout::MatchTest>::~shared_ptr((shared_ptr<oout::MatchTest> *)&local_40.field_2);
  std::shared_ptr<oout::StartsWithMatch>::~shared_ptr
            ((shared_ptr<oout::StartsWithMatch> *)&local_40);
  return;
}

Assistant:

StartsWithTest::StartsWithTest(const shared_ptr<const Text> &a, const string &b)
	: test(make_shared<MatchTest>(a, make_shared<StartsWithMatch>(b)))
{
}